

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  WaitStatementSyntax *pWVar1;
  Token TVar2;
  NamedLabelSyntax **unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  Token *in_stack_00000020;
  StatementSyntax *in_stack_00000028;
  BumpAllocator *in_stack_00000038;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000040;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  StatementSyntax *in_stack_ffffffffffffff90;
  NamedLabelSyntax *local_58;
  Info *args_4;
  
  if (*(long *)(__fn + 0x18) == 0) {
    local_58 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_58 = deepClone<slang::syntax::NamedLabelSyntax>
                         ((NamedLabelSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000040,in_stack_00000038);
  TVar2 = parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  args_4 = TVar2.info;
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7a8621);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x7a8664);
  deepClone<slang::syntax::StatementSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pWVar1 = BumpAllocator::
           emplace<slang::syntax::WaitStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     (in_stack_00000008,unaff_retaddr,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      (Token *)__child_stack,(Token *)local_58,(ExpressionSyntax *)args_4,
                      in_stack_00000020,in_stack_00000028);
  return (int)pWVar1;
}

Assistant:

static SyntaxNode* clone(const WaitStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<WaitStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.wait.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}